

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_hsort(size_t element_len)

{
  uint32_t uVar1;
  undefined8 uVar2;
  int iVar3;
  char *pcVar4;
  size_t count;
  test_hsort_cmp_data data;
  uchar elements [4225];
  
  memset(elements,0,0x1081);
  data.counter = 0;
  data.element_len = element_len;
  secp256k1_hsort(elements,0,element_len,test_hsort_cmp,&data);
  if (data.counter == 0) {
    secp256k1_hsort(elements,1,element_len,test_hsort_cmp,&data);
    if (data.counter == 0) {
      secp256k1_hsort(elements,0x41,element_len,test_hsort_cmp,&data);
      if (0x3f < data.counter) {
        test_hsort_is_sorted(elements,0x41,element_len);
        for (iVar3 = 0; iVar3 < COUNT; iVar3 = iVar3 + 1) {
          uVar1 = testrand_int(0x41);
          count = (size_t)(int)uVar1;
          testrand_bytes_test(elements,count * element_len);
          secp256k1_hsort(elements,count,element_len,test_hsort_cmp,&data);
          test_hsort_is_sorted(elements,count,element_len);
        }
        return;
      }
      pcVar4 = "test condition failed: data.counter >= NUM - 1";
      uVar2 = 0xe1d;
    }
    else {
      pcVar4 = "test condition failed: data.counter == 0";
      uVar2 = 0xe1b;
    }
  }
  else {
    pcVar4 = "test condition failed: data.counter == 0";
    uVar2 = 0xe19;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
          ,uVar2,pcVar4);
  abort();
}

Assistant:

static void test_hsort(size_t element_len) {
    unsigned char elements[NUM * MAX_ELEMENT_LEN] = { 0 };
    struct test_hsort_cmp_data data;
    int i;

    VERIFY_CHECK(element_len <= MAX_ELEMENT_LEN);
    data.counter = 0;
    data.element_len = element_len;

    secp256k1_hsort(elements, 0, element_len, test_hsort_cmp, &data);
    CHECK(data.counter == 0);
    secp256k1_hsort(elements, 1, element_len, test_hsort_cmp, &data);
    CHECK(data.counter == 0);
    secp256k1_hsort(elements, NUM, element_len, test_hsort_cmp, &data);
    CHECK(data.counter >= NUM - 1);
    test_hsort_is_sorted(elements, NUM, element_len);

    /* Test hsort with array of random length n */
    for (i = 0; i < COUNT; i++) {
        int n = testrand_int(NUM);
        testrand_bytes_test(elements, n*element_len);
        secp256k1_hsort(elements, n, element_len, test_hsort_cmp, &data);
        test_hsort_is_sorted(elements, n, element_len);
    }
}